

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_user_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  SessionHandle *data;
  char *pcVar1;
  CURLcode CVar2;
  char *pcVar3;
  anon_union_264_9_0449b319_for_proto *pp;
  
  data = conn->data;
  pp = &conn->proto;
  if (ftpcode == 0x14b) {
    if ((conn->proto).ftpc.state == FTP_USER) {
      pcVar1 = *(char **)((long)(data->req).protop + 0x10);
      pcVar3 = "";
      if (pcVar1 != (char *)0x0) {
        pcVar3 = pcVar1;
      }
      CVar2 = Curl_pp_sendf(&(pp->ftpc).pp,"PASS %s",pcVar3);
      if (CVar2 == CURLE_OK) {
        (conn->proto).ftpc.state = FTP_PASS;
        return CURLE_OK;
      }
      return CVar2;
    }
  }
  else {
    if (ftpcode - 200U < 100) {
      CVar2 = ftp_state_loggedin(conn);
      return CVar2;
    }
    if (ftpcode == 0x14c) {
      if ((data->set).str[7] == (char *)0x0) {
        Curl_failf(data,"ACCT requested but none available");
        return CURLE_LOGIN_DENIED;
      }
      CVar2 = Curl_pp_sendf(&(pp->ftpc).pp,"ACCT %s");
      if (CVar2 == CURLE_OK) {
        (conn->proto).ftpc.state = FTP_ACCT;
        return CURLE_OK;
      }
      return CVar2;
    }
  }
  if (((data->set).str[8] != (char *)0x0) && ((data->state).ftp_trying_alternative == false)) {
    CVar2 = Curl_pp_sendf(&(pp->ftpc).pp,"%s");
    if (CVar2 == CURLE_OK) {
      (conn->data->state).ftp_trying_alternative = true;
      (conn->proto).ftpc.state = FTP_USER;
      return CURLE_OK;
    }
    return CVar2;
  }
  Curl_failf(data,"Access denied: %03d",ftpcode);
  return CURLE_LOGIN_DENIED;
}

Assistant:

static CURLcode ftp_state_user_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  (void)instate; /* no use for this yet */

  /* some need password anyway, and others just return 2xx ignored */
  if((ftpcode == 331) && (ftpc->state == FTP_USER)) {
    /* 331 Password required for ...
       (the server requires to send the user's password too) */
    PPSENDF(&ftpc->pp, "PASS %s", ftp->passwd?ftp->passwd:"");
    state(conn, FTP_PASS);
  }
  else if(ftpcode/100 == 2) {
    /* 230 User ... logged in.
       (the user logged in with or without password) */
    result = ftp_state_loggedin(conn);
  }
  else if(ftpcode == 332) {
    if(data->set.str[STRING_FTP_ACCOUNT]) {
      PPSENDF(&ftpc->pp, "ACCT %s", data->set.str[STRING_FTP_ACCOUNT]);
      state(conn, FTP_ACCT);
    }
    else {
      failf(data, "ACCT requested but none available");
      result = CURLE_LOGIN_DENIED;
    }
  }
  else {
    /* All other response codes, like:

    530 User ... access denied
    (the server denies to log the specified user) */

    if(conn->data->set.str[STRING_FTP_ALTERNATIVE_TO_USER] &&
        !conn->data->state.ftp_trying_alternative) {
      /* Ok, USER failed.  Let's try the supplied command. */
      PPSENDF(&conn->proto.ftpc.pp, "%s",
              conn->data->set.str[STRING_FTP_ALTERNATIVE_TO_USER]);
      conn->data->state.ftp_trying_alternative = TRUE;
      state(conn, FTP_USER);
      result = CURLE_OK;
    }
    else {
      failf(data, "Access denied: %03d", ftpcode);
      result = CURLE_LOGIN_DENIED;
    }
  }
  return result;
}